

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decorator.cpp
# Opt level: O2

int __thiscall Rml::Decorator::GetNumTextures(Decorator *this)

{
  bool bVar1;
  
  bVar1 = Texture::operator_cast_to_bool(&this->first_texture);
  return (int)((ulong)((long)(this->additional_textures).
                             super__Vector_base<Rml::Texture,_std::allocator<Rml::Texture>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                      (long)(this->additional_textures).
                            super__Vector_base<Rml::Texture,_std::allocator<Rml::Texture>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 4) + (uint)bVar1;
}

Assistant:

int Decorator::GetNumTextures() const
{
	int result = (first_texture ? 1 : 0);
	result += (int)additional_textures.size();
	return result;
}